

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int PHF::init<std::__cxx11::string,true>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  ulong uVar3;
  byte bVar4;
  void *pvVar5;
  void *pvVar6;
  uint32_t uVar7;
  size_t __nmemb;
  string *psVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  int iVar14;
  size_t sVar15;
  string *psVar16;
  string *psVar17;
  ulong uVar18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  void *local_a0;
  ulong local_98;
  string *local_90;
  phf *local_88;
  uint32_t *local_80;
  string *local_78;
  size_t local_70;
  void *local_68;
  string *local_60;
  size_t local_58;
  size_t local_50;
  void *local_48;
  string *local_40;
  phf_seed_t local_34;
  
  uVar18 = n + (n == 0);
  uVar11 = l + (l == 0);
  sVar15 = 100;
  if (a < 100) {
    sVar15 = a;
  }
  phf->nodiv = true;
  if (uVar18 <= uVar11) {
    uVar11 = uVar18;
  }
  local_88 = phf;
  local_34 = seed;
  __nmemb = phf_powerup(uVar18 / uVar11);
  local_58 = phf_powerup((uVar18 * 100) / (sVar15 + (sVar15 == 0)));
  if (local_58 == 0 || __nmemb == 0) {
    iVar14 = 0x22;
  }
  else {
    local_40 = (string *)n;
    psVar8 = (string *)calloc(uVar18,0x30);
    if ((psVar8 == (string *)0x0) || (local_68 = calloc(__nmemb,8), local_68 == (void *)0x0)) {
      local_48 = (void *)0x0;
      local_68 = (void *)0x0;
    }
    else {
      local_60 = (string *)CONCAT44(local_60._4_4_,(int)__nmemb + -1);
      psVar17 = local_40;
      local_78 = psVar8;
      local_70 = __nmemb;
      local_50 = uVar18;
      while (psVar16 = local_78, bVar19 = psVar17 != (string *)0x0, psVar17 = psVar17 + -1, bVar19)
      {
        std::__cxx11::string::string(local_c0,(string *)k);
        std::__cxx11::string::string((string *)&local_e0,local_c0);
        uVar7 = phf_g<std::__cxx11::string>(&local_e0,local_34);
        uVar13 = uVar7 & (uint)local_60;
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::_M_assign(psVar8);
        *(uint *)(psVar8 + 0x20) = uVar13;
        plVar1 = (long *)((long)local_68 + (ulong)uVar13 * 8);
        *plVar1 = *plVar1 + 1;
        *(void **)(psVar8 + 0x28) = (void *)((long)local_68 + (ulong)uVar13 * 8);
        k = k + 1;
        psVar8 = psVar8 + 0x30;
      }
      qsort(local_78,local_50,0x30,phf_keycmp<std::__cxx11::string>);
      uVar11 = local_58 + 0x3f >> 6;
      local_48 = calloc(uVar11 * 2,8);
      psVar8 = psVar16;
      if (local_48 == (void *)0x0) {
        local_48 = (void *)0x0;
      }
      else {
        local_80 = (uint32_t *)calloc(local_70,4);
        if (local_80 != (uint32_t *)0x0) {
          local_a0 = (void *)((long)local_48 + uVar11 * 8);
          local_90 = psVar16 + (long)local_40 * 0x30;
          sVar12 = 0;
LAB_001147cb:
          if ((psVar16 < local_90) && (lVar10 = **(long **)(psVar16 + 0x28), lVar10 != 0)) {
            local_50 = 0;
            local_98 = sVar12 & 0xffffffff;
            local_40 = psVar16;
            do {
              local_50 = local_50 + 1;
              local_60 = local_40 + lVar10 * 0x30;
              psVar8 = local_40;
              while( true ) {
                pvVar6 = local_48;
                sVar12 = local_50;
                psVar17 = local_40;
                if (local_60 <= psVar8) goto LAB_001148ed;
                std::__cxx11::string::string((string *)&local_140,psVar8);
                uVar7 = phf_f_mod_m<true,std::__cxx11::string>
                                  ((uint32_t)sVar12,&local_140,local_34,local_58);
                std::__cxx11::string::~string((string *)&local_140);
                pvVar5 = local_a0;
                uVar11 = (ulong)(uVar7 >> 6);
                uVar18 = 1L << ((byte)uVar7 & 0x3f);
                psVar17 = local_40;
                if (((*(ulong *)((long)pvVar6 + uVar11 * 8) >> ((ulong)uVar7 & 0x3f) & 1) != 0) ||
                   (uVar3 = *(ulong *)((long)local_a0 + uVar11 * 8), (uVar3 & uVar18) != 0)) break;
                *(ulong *)((long)local_a0 + uVar11 * 8) = uVar3 | uVar18;
                psVar8 = psVar8 + 0x30;
              }
              for (; sVar12 = local_50, psVar17 < local_60; psVar17 = psVar17 + 0x30) {
                std::__cxx11::string::string((string *)&local_120,psVar17);
                uVar7 = phf_f_mod_m<true,std::__cxx11::string>
                                  ((uint32_t)sVar12,&local_120,local_34,local_58);
                std::__cxx11::string::~string((string *)&local_120);
                bVar4 = (byte)uVar7 & 0x3f;
                puVar2 = (ulong *)((long)pvVar5 + (ulong)(uVar7 >> 6) * 8);
                *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              }
              lVar10 = **(long **)(local_40 + 0x28);
            } while( true );
          }
          local_88->seed = local_34;
          local_88->r = local_70;
          local_88->m = local_58;
          local_88->g = local_80;
          local_88->d_max = sVar12 & 0xffffffff;
          local_88->g_op = PHF_G_UINT32_BAND_R;
          local_88->g_jmp = (void *)0x0;
          iVar14 = 0;
          psVar8 = local_78;
          goto LAB_00114719;
        }
      }
    }
    piVar9 = __errno_location();
    iVar14 = *piVar9;
LAB_00114719:
    free(local_48);
    free(local_68);
    free(psVar8);
  }
  return iVar14;
LAB_001148ed:
  for (; uVar7 = (uint32_t)local_50, psVar17 < local_60; psVar17 = psVar17 + 0x30) {
    std::__cxx11::string::string((string *)&local_100,psVar17);
    uVar7 = phf_f_mod_m<true,std::__cxx11::string>(uVar7,&local_100,local_34,local_58);
    std::__cxx11::string::~string((string *)&local_100);
    puVar2 = (ulong *)((long)local_48 + (ulong)(uVar7 >> 6) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)uVar7 & 0x3f);
  }
  local_80[*(uint *)(local_40 + 0x20)] = uVar7;
  sVar12 = local_98;
  if (local_98 < local_50) {
    sVar12 = local_50;
  }
  psVar16 = local_40 + **(long **)(local_40 + 0x28) * 0x30;
  goto LAB_001147cb;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}